

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutil.cpp
# Opt level: O0

size_t first_word_end(string *str,size_t start)

{
  ulong uVar1;
  string *in_RDI;
  size_t next_word_end;
  size_t next_word_start;
  string chars;
  allocator local_39;
  string local_38 [40];
  string *local_10;
  ulong local_8;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"\t\n\v\f\r ",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::find_first_not_of(local_10,(ulong)local_38);
  local_8 = std::__cxx11::string::find_first_of(local_10,(ulong)local_38);
  if ((local_8 == 0xffffffffffffffff) || (uVar1 = std::__cxx11::string::size(), uVar1 < local_8)) {
    local_8 = std::__cxx11::string::size();
  }
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

size_t first_word_end(std::string& str, size_t start) {
  const std::string chars = "\t\n\v\f\r ";
  size_t next_word_start = str.find_first_not_of(chars, start);
  size_t next_word_end = str.find_first_of(chars, next_word_start);
  if (next_word_end == std::string::npos || next_word_end > str.size())
    return str.size();
  return next_word_end;
}